

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     sub<false,(InstructionSet::x86::AccessType)2,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (access_t<unsigned_short,_(InstructionSet::x86::AccessType)2> destination,
               read_t<unsigned_short> source,Context *context)

{
  ushort uVar1;
  bool bVar2;
  unsigned_short result;
  uint uVar3;
  uint uVar4;
  
  uVar3 = (uint)*destination - (uint)source;
  result = (unsigned_short)uVar3;
  bVar2 = Numeric::carried_out<false,15,unsigned_short>(*destination,source,result);
  (context->flags).carry_ = (uint)bVar2;
  uVar1 = *destination;
  uVar4 = (uint)(source ^ uVar1);
  (context->flags).auxiliary_carry_ = (uVar4 ^ uVar3) >> 4 & 1;
  (context->flags).overflow_ = (uVar3 ^ uVar1) & uVar4 & 0x8000;
  Flags::
  set_from<unsigned_short,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,result);
  *destination = result;
  return;
}

Assistant:

void sub(
	access_t<IntT, destination_type> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST - (SRC [+ CF]);
	*/
	/*
		The OF, SF, ZF, AF, CF, and PF flags are set according to the result.
	*/
	const IntT result = destination - source - (with_borrow ? context.flags.template carry_bit<IntT>() : 0);

	context.flags.template set_from<Flag::Carry>(
		Numeric::carried_out<false, Numeric::bit_size<IntT>() - 1>(destination, source, result));
	context.flags.template set_from<Flag::AuxiliaryCarry>(
		Numeric::carried_in<4>(destination, source, result));
	context.flags.template set_from<Flag::Overflow>(
		Numeric::overflow<false, IntT>(destination, source, result));

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(result);

	if constexpr (is_writeable(destination_type)) {
		destination = result;
	}
}